

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O2

bool __thiscall
bssl::ECHServerConfig::Init
          (ECHServerConfig *this,Span<const_unsigned_char> ech_config,EVP_HPKE_KEY *key,
          bool is_retry_config)

{
  uint16_t uVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  EVP_HPKE_AEAD *pEVar5;
  EVP_HPKE_KEM *kem;
  int iVar6;
  Span<const_unsigned_char> lhs;
  bool supported;
  size_t expected_public_key_len;
  CBS cipher_suites;
  CBS cbs;
  uint8_t expected_public_key [65];
  
  cbs.len = ech_config.size_;
  cbs.data = ech_config.data_;
  this->is_retry_config_ = is_retry_config;
  bVar2 = parse_ech_config(&cbs,&this->ech_config_,&supported,true);
  if (bVar2) {
    if (cbs.len == 0) {
      if (supported == false) {
        iVar4 = 0x138;
        iVar6 = 0x201;
      }
      else {
        cipher_suites.data = (this->ech_config_).cipher_suites.data_;
        cipher_suites.len = (this->ech_config_).cipher_suites.size_;
        while (cipher_suites.len != 0) {
          iVar4 = CBS_get_u16(&cipher_suites,(uint16_t *)expected_public_key);
          if ((iVar4 == 0) ||
             (iVar4 = CBS_get_u16(&cipher_suites,(uint16_t *)&expected_public_key_len), iVar4 == 0))
          {
            iVar4 = 0x89;
            iVar6 = 0x20a;
            goto LAB_0020825f;
          }
          if ((expected_public_key._0_2_ != 1) ||
             (pEVar5 = get_ech_aead((uint16_t)expected_public_key_len),
             pEVar5 == (EVP_HPKE_AEAD *)0x0)) {
            iVar4 = 0x138;
            iVar6 = 0x210;
LAB_0020825f:
            ERR_put_error(0x10,0,iVar4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                          ,iVar6);
            return false;
          }
        }
        iVar4 = EVP_HPKE_KEY_public_key(key,expected_public_key,&expected_public_key_len,0x41);
        if (iVar4 == 0) {
          return false;
        }
        uVar1 = (this->ech_config_).kem_id;
        kem = EVP_HPKE_KEY_kem(key);
        uVar3 = EVP_HPKE_KEM_id(kem);
        if ((uVar1 == uVar3) &&
           (lhs.size_._2_6_ = expected_public_key_len._2_6_,
           lhs.size_._0_2_ = (uint16_t)expected_public_key_len, lhs.data_ = expected_public_key,
           bVar2 = internal::operator!=(lhs,(this->ech_config_).public_key), !bVar2)) {
          iVar4 = EVP_HPKE_KEY_copy(&(this->key_).ctx_,key);
          return iVar4 != 0;
        }
        iVar4 = 0x136;
        iVar6 = 0x220;
      }
    }
    else {
      iVar4 = 0x89;
      iVar6 = 0x1fd;
    }
    ERR_put_error(0x10,0,iVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,iVar6);
  }
  return false;
}

Assistant:

bool ECHServerConfig::Init(Span<const uint8_t> ech_config,
                           const EVP_HPKE_KEY *key, bool is_retry_config) {
  is_retry_config_ = is_retry_config;

  // Parse the ECHConfig, rejecting all unsupported parameters and extensions.
  // Unlike most server options, ECH's server configuration is serialized and
  // configured in both the server and DNS. If the caller configures an
  // unsupported parameter, this is a deployment error. To catch these errors,
  // we fail early.
  CBS cbs = ech_config;
  bool supported;
  if (!parse_ech_config(&cbs, &ech_config_, &supported,
                        /*all_extensions_mandatory=*/true)) {
    return false;
  }
  if (CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }
  if (!supported) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNSUPPORTED_ECH_SERVER_CONFIG);
    return false;
  }

  CBS cipher_suites = ech_config_.cipher_suites;
  while (CBS_len(&cipher_suites) > 0) {
    uint16_t kdf_id, aead_id;
    if (!CBS_get_u16(&cipher_suites, &kdf_id) ||
        !CBS_get_u16(&cipher_suites, &aead_id)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return false;
    }
    // The server promises to support every option in the ECHConfig, so reject
    // any unsupported cipher suites.
    if (kdf_id != EVP_HPKE_HKDF_SHA256 || get_ech_aead(aead_id) == nullptr) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNSUPPORTED_ECH_SERVER_CONFIG);
      return false;
    }
  }

  // Check the public key in the ECHConfig matches |key|.
  uint8_t expected_public_key[EVP_HPKE_MAX_PUBLIC_KEY_LENGTH];
  size_t expected_public_key_len;
  if (!EVP_HPKE_KEY_public_key(key, expected_public_key,
                               &expected_public_key_len,
                               sizeof(expected_public_key))) {
    return false;
  }
  if (ech_config_.kem_id != EVP_HPKE_KEM_id(EVP_HPKE_KEY_kem(key)) ||
      Span(expected_public_key, expected_public_key_len) !=
          ech_config_.public_key) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_ECH_SERVER_CONFIG_AND_PRIVATE_KEY_MISMATCH);
    return false;
  }

  if (!EVP_HPKE_KEY_copy(key_.get(), key)) {
    return false;
  }

  return true;
}